

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

int poptGetNextOpt(poptContext con)

{
  long lVar1;
  optionStackEntry *poVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint argInfo_00;
  size_t sVar6;
  char *pcVar7;
  void *pvVar8;
  undefined1 *puVar9;
  bool bVar10;
  int local_d4;
  size_t local_c8;
  int local_b8;
  char *local_98;
  char *s;
  int rc;
  uint argInfo_1;
  long val;
  char *nextCharArg;
  char *pcStack_70;
  uint argInfo;
  char *oe;
  int thisopt;
  size_t optStringLen;
  char *optString;
  int shorty;
  int canstrip;
  char *longArg;
  void *cbData;
  poptCallbackType cb;
  char *origOptString;
  poptOption *ppStack_20;
  int done;
  poptOption *opt;
  poptContext con_local;
  
  ppStack_20 = (poptOption *)0x0;
  origOptString._4_4_ = 0;
  opt = (poptOption *)con;
  if (con == (poptContext)0x0) {
    con_local._4_4_ = -1;
  }
  else {
LAB_00103b63:
    if (origOptString._4_4_ == 0) {
      cb = (poptCallbackType)0x0;
      cbData = (void *)0x0;
      longArg = (char *)0x0;
      _shorty = (char *)0x0;
      bVar3 = false;
      while( true ) {
        bVar10 = false;
        if ((*(long *)((long)opt[0xd].arg + 0x28) == 0) &&
           (bVar10 = false, *(int *)((long)opt[0xd].arg + 0x18) == *opt[0xd].arg)) {
          bVar10 = opt < (poptOption *)opt[0xd].arg;
        }
        if (!bVar10) break;
        poVar2 = (optionStackEntry *)opt[0xd].arg;
        opt[0xd].arg = poVar2 + -1;
        cleanOSE(poVar2);
      }
      if ((*(long *)((long)opt[0xd].arg + 0x28) == 0) &&
         (*(int *)((long)opt[0xd].arg + 0x18) == *opt[0xd].arg)) {
        invokeCallbacksPOST((poptContext)opt,(poptOption *)opt[0xe].longName);
        if (opt[0xf].descrip != (char *)0x0) {
          (*(code *)opt[0xf].descrip)(opt[0xf].val,opt[0xf].arg);
          return -1;
        }
        if (opt[0xf].argDescrip != (char *)0x0) {
          iVar4 = execCommand((poptContext)opt);
          return iVar4;
        }
        return -1;
      }
      if (*(long *)((long)opt[0xd].arg + 0x28) == 0) {
        if ((*(long *)((long)opt[0xd].arg + 0x10) == 0) ||
           ((*(uint *)(*(long *)((long)opt[0xd].arg + 0x10) +
                      ((ulong)(long)*(int *)((long)opt[0xd].arg + 0x18) >> 5) * 4) &
            1 << ((byte)*(undefined4 *)((long)opt[0xd].arg + 0x18) & 0x1f)) == 0)) {
          iVar4 = *(int *)((long)opt[0xd].arg + 0x18);
          if (*(long *)((long)opt[0xd].arg + 8) != 0) {
            lVar1 = *(long *)((long)opt[0xd].arg + 8);
            iVar5 = *(int *)((long)opt[0xd].arg + 0x18);
            *(int *)((long)opt[0xd].arg + 0x18) = iVar5 + 1;
            cb = *(poptCallbackType *)(lVar1 + (long)iVar5 * 8);
          }
          if (cb == (poptCallbackType)0x0) {
            return -0xb;
          }
          if (((*(int *)&opt[0xe].shortName == 0) &&
              (*cb == (_func_void_poptContext_poptCallbackReason_poptOption_ptr_char_ptr_void_ptr)
                      0x2d)) &&
             ((*cb != (_func_void_poptContext_poptCallbackReason_poptOption_ptr_char_ptr_void_ptr)
                      0x2d ||
              (cb[1] != (_func_void_poptContext_poptCallbackReason_poptOption_ptr_char_ptr_void_ptr)
                        0x0)))) {
            if (*cb == (_func_void_poptContext_poptCallbackReason_poptOption_ptr_char_ptr_void_ptr)
                       0x0) {
              return -0xb;
            }
            if ((cb[1] == (_func_void_poptContext_poptCallbackReason_poptOption_ptr_char_ptr_void_ptr
                           )0x2d) &&
               (cb[2] == (_func_void_poptContext_poptCallbackReason_poptOption_ptr_char_ptr_void_ptr
                         )0x0)) {
              *(undefined4 *)&opt[0xe].shortName = 1;
            }
            else {
              nextCharArg._4_4_ = 0;
              optStringLen = (size_t)(cb + 1);
              if (*(code *)optStringLen == (code)0x2d) {
                optStringLen = (size_t)(cb + 2);
              }
              else {
                nextCharArg._4_4_ = 0x80000000;
              }
              pcStack_70 = (char *)optStringLen;
              while( true ) {
                bVar10 = false;
                if (*pcStack_70 != '\0') {
                  bVar10 = *pcStack_70 != '=';
                }
                if (!bVar10) break;
                pcStack_70 = pcStack_70 + 1;
              }
              if (*pcStack_70 == '=') {
                _shorty = pcStack_70 + 1;
              }
              iVar5 = handleAlias((poptContext)opt,(char *)optStringLen,
                                  (long)pcStack_70 - optStringLen,'\0',_shorty);
              if ((iVar5 == 0) &&
                 (iVar5 = handleExec((poptContext)opt,(char *)optStringLen,'\0'), iVar5 == 0)) {
                ppStack_20 = findOption((poptOption *)opt[0xe].longName,(char *)optStringLen,
                                        (long)pcStack_70 - optStringLen,'\0',
                                        (poptCallbackType *)&cbData,&longArg,nextCharArg._4_4_);
                if ((ppStack_20 == (poptOption *)0x0) && (nextCharArg._4_4_ == 0)) {
                  return -0xb;
                }
                if (ppStack_20 == (poptOption *)0x0) {
                  *(poptCallbackType *)((long)opt[0xd].arg + 0x28) = cb + 1;
                  _shorty = (char *)0x0;
                }
                else if (((poptOption *)opt[0xd].arg == opt) &&
                        ((ppStack_20->argInfo & 0x20000000) != 0)) {
                  bVar3 = true;
                  poptStripArg((poptContext)opt,iVar4);
                }
                goto LAB_00104185;
              }
            }
          }
          else {
            if (((ulong)opt[0xe].descrip & 0x400000000) != 0) {
              *(undefined4 *)&opt[0xe].shortName = 1;
            }
            if (((ulong)opt[0xe].descrip & 0x1000000000) != 0) {
              sVar6 = strlen((char *)cb);
              pcVar7 = (char *)malloc(sVar6 + 1);
              if (pcVar7 != (char *)0x0) {
                pcVar7 = strcpy(pcVar7,(char *)cb);
                *(char **)((long)opt[0xd].arg + 0x20) = pcVar7;
                return 0;
              }
              fprintf(_stderr,"virtual memory exhausted.\n");
              exit(1);
            }
            if (*(long *)&opt[0xd].val != 0) {
              if (*(int *)((long)&opt[0xd].descrip + 4) <= *(int *)&opt[0xd].descrip + 1) {
                *(int *)((long)&opt[0xd].descrip + 4) = *(int *)((long)&opt[0xd].descrip + 4) + 10;
                pvVar8 = realloc(*(void **)&opt[0xd].val,
                                 (long)*(int *)((long)&opt[0xd].descrip + 4) << 3);
                *(void **)&opt[0xd].val = pvVar8;
              }
              sVar6 = strlen((char *)cb);
              pcVar7 = (char *)malloc(sVar6 + 1);
              if (pcVar7 == (char *)0x0) {
                fprintf(_stderr,"virtual memory exhausted.\n");
                exit(1);
              }
              pcVar7 = strcpy(pcVar7,(char *)cb);
              iVar4 = *(int *)&opt[0xd].descrip;
              *(int *)&opt[0xd].descrip = iVar4 + 1;
              *(char **)(*(long *)&opt[0xd].val + (long)iVar4 * 8) = pcVar7;
            }
          }
        }
        else {
          *(int *)((long)opt[0xd].arg + 0x18) = *(int *)((long)opt[0xd].arg + 0x18) + 1;
        }
        goto LAB_00103b63;
      }
LAB_00104185:
      optString._0_4_ = 0;
      if (*(long *)((long)opt[0xd].arg + 0x28) != 0) {
        pcVar7 = *(char **)((long)opt[0xd].arg + 0x28);
        *(undefined8 *)((long)opt[0xd].arg + 0x28) = 0;
        iVar4 = handleAlias((poptContext)opt,(char *)0x0,0,*pcVar7,pcVar7 + 1);
        if (iVar4 != 0) goto LAB_00103b63;
        iVar4 = handleExec((poptContext)opt,(char *)0x0,*pcVar7);
        if (iVar4 != 0) {
          if (pcVar7[1] != '\0') {
            *(char **)((long)opt[0xd].arg + 0x28) = pcVar7 + 1;
          }
          goto LAB_00103b63;
        }
        ppStack_20 = findOption((poptOption *)opt[0xe].longName,(char *)0x0,0,*pcVar7,
                                (poptCallbackType *)&cbData,&longArg,0);
        if (ppStack_20 == (poptOption *)0x0) {
          return -0xb;
        }
        optString._0_4_ = 1;
        if (pcVar7[1] != '\0') {
          *(char **)((long)opt[0xd].arg + 0x28) = pcVar7 + 1;
        }
      }
      if (ppStack_20 == (poptOption *)0x0) {
        return -0xb;
      }
      if (((ppStack_20->argInfo & _poptArgMask) == 0) || ((ppStack_20->argInfo & _poptArgMask) == 7)
         ) {
        if ((_shorty != (char *)0x0) ||
           ((*(long *)((long)opt[0xd].arg + 0x28) != 0 &&
            (**(char **)((long)opt[0xd].arg + 0x28) == '=')))) {
          return -0xc;
        }
        if (ppStack_20->arg != (void *)0x0) {
          if ((ppStack_20->argInfo & _poptArgMask) == 7) {
            local_b8 = ppStack_20->val;
          }
          else {
            local_b8 = 1;
          }
          argInfo_00 = poptArgInfo((poptContext)opt,ppStack_20);
          iVar4 = poptSaveInt((int *)ppStack_20->arg,argInfo_00,(long)local_b8);
          if (iVar4 != 0) {
            return -0x13;
          }
        }
      }
      else {
        pvVar8 = _free(*(void **)((long)opt[0xd].arg + 0x20));
        *(void **)((long)opt[0xd].arg + 0x20) = pvVar8;
        if (_shorty == (char *)0x0) {
          if (*(long *)((long)opt[0xd].arg + 0x28) == 0) {
            while( true ) {
              bVar10 = false;
              if (*(int *)((long)opt[0xd].arg + 0x18) == *opt[0xd].arg) {
                bVar10 = opt < (poptOption *)opt[0xd].arg;
              }
              if (!bVar10) break;
              poVar2 = (optionStackEntry *)opt[0xd].arg;
              opt[0xd].arg = poVar2 + -1;
              cleanOSE(poVar2);
            }
            if (*(int *)((long)opt[0xd].arg + 0x18) == *opt[0xd].arg) {
              if ((ppStack_20->argInfo & 0x10000000) == 0) {
                return -10;
              }
              *(undefined8 *)((long)opt[0xd].arg + 0x20) = 0;
            }
            else {
              if ((((poptOption *)opt[0xd].arg == opt) && ((ppStack_20->argInfo & 0x20000000) != 0))
                 && (bVar3)) {
                poptStripArg((poptContext)opt,*(int *)((long)opt[0xd].arg + 0x18));
              }
              if (*(long *)((long)opt[0xd].arg + 8) != 0) {
                if (((ppStack_20->argInfo & 0x10000000) == 0) ||
                   (**(char **)(*(long *)((long)opt[0xd].arg + 8) +
                               (long)*(int *)((long)opt[0xd].arg + 0x18) * 8) != '-')) {
                  lVar1 = *(long *)((long)opt[0xd].arg + 8);
                  iVar4 = *(int *)((long)opt[0xd].arg + 0x18);
                  *(int *)((long)opt[0xd].arg + 0x18) = iVar4 + 1;
                  pcVar7 = expandNextArg((poptContext)opt,*(char **)(lVar1 + (long)iVar4 * 8));
                  *(char **)((long)opt[0xd].arg + 0x20) = pcVar7;
                }
                else {
                  *(undefined8 *)((long)opt[0xd].arg + 0x20) = 0;
                }
              }
            }
          }
          else {
            pcVar7 = expandNextArg((poptContext)opt,
                                   (char *)(*(long *)((long)opt[0xd].arg + 0x28) +
                                           (long)(int)(uint)(**(char **)((long)opt[0xd].arg + 0x28)
                                                            == '=')));
            *(char **)((long)opt[0xd].arg + 0x20) = pcVar7;
            *(undefined8 *)((long)opt[0xd].arg + 0x28) = 0;
          }
        }
        else {
          pcVar7 = expandNextArg((poptContext)opt,_shorty);
          *(char **)((long)opt[0xd].arg + 0x20) = pcVar7;
        }
        if ((ppStack_20->arg != (void *)0x0) &&
           (iVar4 = poptSaveArg((poptContext)opt,ppStack_20), iVar4 != 0)) {
          return iVar4;
        }
      }
      if (cbData == (void *)0x0) {
        if ((ppStack_20->val != 0) && ((ppStack_20->argInfo & _poptArgMask) != 7)) {
          origOptString._4_4_ = 1;
        }
      }
      else {
        invokeCallbacksOPTION
                  ((poptContext)opt,(poptOption *)opt[0xe].longName,ppStack_20,longArg,
                   (int)optString);
      }
      if (*(int *)&opt[0xf].field_0x1c <= opt[0xf].val + 2) {
        *(int *)&opt[0xf].field_0x1c = *(int *)&opt[0xf].field_0x1c + 10;
        pvVar8 = realloc(opt[0xf].arg,(long)*(int *)&opt[0xf].field_0x1c << 3);
        opt[0xf].arg = pvVar8;
      }
      if (opt[0xf].arg != (void *)0x0) {
        if (ppStack_20->longName == (char *)0x0) {
          local_c8 = 0;
        }
        else {
          local_c8 = strlen(ppStack_20->longName);
        }
        puVar9 = (undefined1 *)malloc(local_c8 + 3);
        if (puVar9 == (undefined1 *)0x0) {
          iVar4 = opt[0xf].val;
          opt[0xf].val = iVar4 + 1;
          *(undefined8 *)((long)opt[0xf].arg + (long)iVar4 * 8) = 0;
        }
        else {
          iVar4 = opt[0xf].val;
          opt[0xf].val = iVar4 + 1;
          *(undefined1 **)((long)opt[0xf].arg + (long)iVar4 * 8) = puVar9;
          pcVar7 = puVar9 + 1;
          *puVar9 = 0x2d;
          if (ppStack_20->longName == (char *)0x0) {
            *pcVar7 = ppStack_20->shortName;
            puVar9[2] = 0;
          }
          else {
            local_98 = pcVar7;
            if ((ppStack_20->argInfo & 0x80000000) == 0) {
              local_98 = puVar9 + 2;
              *pcVar7 = '-';
            }
            stpcpy(local_98,ppStack_20->longName);
          }
        }
      }
      if (((((ppStack_20->arg == (void *)0x0) || ((ppStack_20->argInfo & _poptArgMask) != 0)) &&
           ((ppStack_20->argInfo & _poptArgMask) != 7)) &&
          (((ppStack_20->argInfo & _poptArgMask) != 0 && (opt[0xf].arg != (void *)0x0)))) &&
         (*(long *)((long)opt[0xd].arg + 0x20) != 0)) {
        sVar6 = strlen(*(char **)((long)opt[0xd].arg + 0x20));
        pcVar7 = (char *)malloc(sVar6 + 1);
        if (pcVar7 == (char *)0x0) {
          fprintf(_stderr,"virtual memory exhausted.\n");
          exit(1);
        }
        pcVar7 = strcpy(pcVar7,*(char **)((long)opt[0xd].arg + 0x20));
        iVar4 = opt[0xf].val;
        opt[0xf].val = iVar4 + 1;
        *(char **)((long)opt[0xf].arg + (long)iVar4 * 8) = pcVar7;
      }
      goto LAB_00103b63;
    }
    if (ppStack_20 == (poptOption *)0x0) {
      local_d4 = -1;
    }
    else {
      local_d4 = ppStack_20->val;
    }
    con_local._4_4_ = local_d4;
  }
  return con_local._4_4_;
}

Assistant:

int poptGetNextOpt(poptContext con)
{
    const struct poptOption * opt = NULL;
    int done = 0;

    if (con == NULL)
	return -1;
    while (!done) {
	const char * origOptString = NULL;
	poptCallbackType cb = NULL;
	const void * cbData = NULL;
	const char * longArg = NULL;
	int canstrip = 0;
	int shorty = 0;

	while (!con->os->nextCharArg && con->os->next == con->os->argc
		&& con->os > con->optionStack) {
	    cleanOSE(con->os--);
	}
	if (!con->os->nextCharArg && con->os->next == con->os->argc) {
	    invokeCallbacksPOST(con, con->options);

	    if (con->maincall) {
		(void) (*con->maincall) (con->finalArgvCount, con->finalArgv);
		return -1;
	    }

	    if (con->doExec) return execCommand(con);
	    return -1;
	}

	/* Process next long option */
	if (!con->os->nextCharArg) {
	    const char * optString;
            size_t optStringLen;
	    int thisopt;

	    if (con->os->argb && PBM_ISSET(con->os->next, con->os->argb)) {
		con->os->next++;
		continue;
	    }
	    thisopt = con->os->next;
	    if (con->os->argv != NULL)	/* XXX can't happen */
	    origOptString = con->os->argv[con->os->next++];

	    if (origOptString == NULL)	/* XXX can't happen */
		return POPT_ERROR_BADOPT;

	    if (con->restLeftover || *origOptString != '-' ||
		(*origOptString == '-' && origOptString[1] == '\0'))
	    {
		if (con->flags & POPT_CONTEXT_POSIXMEHARDER)
		    con->restLeftover = 1;
		if (con->flags & POPT_CONTEXT_ARG_OPTS) {
		    con->os->nextArg = xstrdup(origOptString);
		    return 0;
		}
		if (con->leftovers != NULL) {	/* XXX can't happen */
		    /* One might think we can never overflow the leftovers
		       array.  Actually, that's true, as long as you don't
		       use poptStuffArgs()... */
		    if ((con->numLeftovers + 1) >= (con->allocLeftovers)) {
			con->allocLeftovers += 10;
			con->leftovers =
			    realloc(con->leftovers,
				    sizeof(*con->leftovers) * con->allocLeftovers);
		    }
		    con->leftovers[con->numLeftovers++]
			= xstrdup(origOptString); /* so a free of a stuffed
						     argv doesn't give us a
						     dangling pointer */
		}
		continue;
	    }

	    /* Make a copy we can hack at */
	    optString = origOptString;

	    if (optString[0] == '\0')
		return POPT_ERROR_BADOPT;

	    if (optString[1] == '-' && !optString[2]) {
		con->restLeftover = 1;
		continue;
	    } else {
		const char *oe;
		unsigned int argInfo = 0;

		optString++;
		if (*optString == '-')
		    optString++;
		else
		    argInfo |= POPT_ARGFLAG_ONEDASH;

		/* Check for "--long=arg" option. */
		for (oe = optString; *oe && *oe != '='; oe++)
		    {};
		optStringLen = (size_t)(oe - optString);
		if (*oe == '=')
		    longArg = oe + 1;

		/* XXX aliases with arg substitution need "--alias=arg" */
		if (handleAlias(con, optString, optStringLen, '\0', longArg)) {
		    longArg = NULL;
		    continue;
		}

		if (handleExec(con, optString, '\0'))
		    continue;

		opt = findOption(con->options, optString, optStringLen, '\0', &cb, &cbData,
				 argInfo);
		if (!opt && !LF_ISSET(ONEDASH))
		    return POPT_ERROR_BADOPT;
	    }

	    if (!opt) {
		con->os->nextCharArg = origOptString + 1;
		longArg = NULL;
	    } else {
		if (con->os == con->optionStack && F_ISSET(opt, STRIP))
		{
		    canstrip = 1;
		    poptStripArg(con, thisopt);
		}
		shorty = 0;
	    }
	}

	/* Process next short option */
	if (con->os->nextCharArg) {
	    const char * nextCharArg = con->os->nextCharArg;

	    con->os->nextCharArg = NULL;

	    if (handleAlias(con, NULL, 0, *nextCharArg, nextCharArg + 1))
		continue;

	    if (handleExec(con, NULL, *nextCharArg)) {
		/* Restore rest of short options for further processing */
		nextCharArg++;
		if (*nextCharArg != '\0')
		    con->os->nextCharArg = nextCharArg;
		continue;
	    }

	    opt = findOption(con->options, NULL, 0, *nextCharArg, &cb,
			     &cbData, 0);
	    if (!opt)
		return POPT_ERROR_BADOPT;
	    shorty = 1;

	    nextCharArg++;
	    if (*nextCharArg != '\0')
		con->os->nextCharArg = nextCharArg;
	}

	if (opt == NULL) return POPT_ERROR_BADOPT;	/* XXX can't happen */
	if (poptArgType(opt) == POPT_ARG_NONE || poptArgType(opt) == POPT_ARG_VAL) {
	    if (longArg || (con->os->nextCharArg && con->os->nextCharArg[0] == '='))
		return POPT_ERROR_UNWANTEDARG;
	    if (opt->arg) {
		long val = poptArgType(opt) == POPT_ARG_VAL ? opt->val : 1;
		unsigned int argInfo = poptArgInfo(con, opt);
		if (poptSaveInt((int *)opt->arg, argInfo, val))
		    return POPT_ERROR_BADOPERATION;
	    }
	} else {
	    int rc;

	    con->os->nextArg = _free(con->os->nextArg);
	    if (longArg) {
		longArg = expandNextArg(con, longArg);
		con->os->nextArg = (char *) longArg;
	    } else if (con->os->nextCharArg) {
		longArg = expandNextArg(con, con->os->nextCharArg + (int)(*con->os->nextCharArg == '='));
		con->os->nextArg = (char *) longArg;
		con->os->nextCharArg = NULL;
	    } else {
		while (con->os->next == con->os->argc &&
			con->os > con->optionStack)
		{
		    cleanOSE(con->os--);
		}
		if (con->os->next == con->os->argc) {
		    if (!F_ISSET(opt, OPTIONAL))
			return POPT_ERROR_NOARG;
		    con->os->nextArg = NULL;
		} else {

		    /*
		     * Make sure this isn't part of a short arg or the
		     * result of an alias expansion.
		     */
		    if (con->os == con->optionStack
		     && F_ISSET(opt, STRIP) && canstrip)
		    {
			poptStripArg(con, con->os->next);
		    }
		
		    if (con->os->argv != NULL) {	/* XXX can't happen */
			if (F_ISSET(opt, OPTIONAL) &&
			    con->os->argv[con->os->next][0] == '-') {
			    con->os->nextArg = NULL;
			} else {
			    /* XXX watchout: subtle side-effects live here. */
			    longArg = con->os->argv[con->os->next++];
			    longArg = expandNextArg(con, longArg);
			    con->os->nextArg = (char *) longArg;
			}
		    }
		}
	    }
	    longArg = NULL;

	   /* Save the option argument through a (*opt->arg) pointer. */
	    if (opt->arg != NULL && (rc = poptSaveArg(con, opt)) != 0)
		return rc;
	}

	if (cb)
	    invokeCallbacksOPTION(con, con->options, opt, cbData, shorty);
	else if (opt->val && (poptArgType(opt) != POPT_ARG_VAL))
	    done = 1;

	if ((con->finalArgvCount + 2) >= (con->finalArgvAlloced)) {
	    con->finalArgvAlloced += 10;
	    con->finalArgv = realloc(con->finalArgv,
			    sizeof(*con->finalArgv) * con->finalArgvAlloced);
	}

	if (con->finalArgv != NULL)
	{   char *s = malloc((opt->longName ? strlen(opt->longName) : 0) + sizeof("--"));
	    if (s != NULL) {	/* XXX can't happen */
		con->finalArgv[con->finalArgvCount++] = s;
		*s++ = '-';
		if (opt->longName) {
		    if (!F_ISSET(opt, ONEDASH))
			*s++ = '-';
		    s = stpcpy(s, opt->longName);
		} else {
		    *s++ = opt->shortName;
		    *s = '\0';
		}
	    } else
		con->finalArgv[con->finalArgvCount++] = NULL;
	}

	if (opt->arg && poptArgType(opt) == POPT_ARG_NONE)
	    ;
	else if (poptArgType(opt) == POPT_ARG_VAL)
	    ;
	else if (poptArgType(opt) != POPT_ARG_NONE) {
	    if (con->finalArgv != NULL && con->os->nextArg != NULL)
	        con->finalArgv[con->finalArgvCount++] =
			xstrdup(con->os->nextArg);
	}
    }

    return (opt ? opt->val : -1);	/* XXX can't happen */
}